

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,with_statement *s)

{
  expression *e;
  global_object *pgVar1;
  statement *s_00;
  object_ptr local_a8;
  undefined1 local_98 [8];
  auto_scope with_scope;
  value local_70;
  undefined1 local_48 [8];
  value val;
  with_statement *s_local;
  impl *this_local;
  
  val.field_1._24_8_ = s;
  e = with_statement::e(s);
  eval(&local_70,this,e);
  get_value((value *)local_48,this,&local_70);
  value::~value(&local_70);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  (*(pgVar1->super_object)._vptr_object[0x11])(&local_a8,pgVar1,local_48);
  auto_scope::auto_scope((auto_scope *)local_98,this,&local_a8,&this->active_scope_);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_a8);
  s_00 = with_statement::s((with_statement *)val.field_1._24_8_);
  eval(__return_storage_ptr__,this,s_00);
  auto_scope::~auto_scope((auto_scope *)local_98);
  value::~value((value *)local_48);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const with_statement& s) {
        auto val = get_value(eval(s.e()));
        auto_scope with_scope{*this, global_->to_object(val), active_scope_};
        return eval(s.s());
    }